

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O1

_Bool chck_pool(chck_pool *pool,size_t grow,size_t capacity,size_t member_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sz;
  ulong uVar5;
  bool bVar6;
  _Bool _Var7;
  
  if ((pool != (chck_pool *)0x0) && (member_size != 0)) {
    _Var7 = false;
    memset(pool,0,0x90);
    uVar5 = 0x20;
    if (grow != 0) {
      uVar5 = grow;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = member_size;
    bVar6 = SUB168(auVar1 * auVar3,8) == 0;
    (pool->items).step = SUB168(auVar1 * auVar3,0);
    if (bVar6) {
      (pool->items).member = member_size;
      if ((capacity != 0) &&
         (auVar2._8_8_ = 0, auVar2._0_8_ = capacity, auVar4._8_8_ = 0, auVar4._0_8_ = member_size,
         SUB168(auVar2 * auVar4,8) == 0)) {
        pool_buffer_resize(&pool->items,SUB168(auVar2 * auVar4,0));
      }
      if (bVar6) {
        (pool->map).step = uVar5;
        (pool->map).member = 1;
        if (capacity != 0) {
          pool_buffer_resize(&pool->map,capacity);
        }
        (pool->removed).step = uVar5 << 3;
        _Var7 = uVar5 >> 0x3d == 0;
        if (_Var7) {
          (pool->removed).member = 8;
        }
      }
      else {
        _Var7 = false;
      }
    }
    return _Var7;
  }
  __assert_fail("pool && member_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x11c,"_Bool chck_pool(struct chck_pool *, size_t, size_t, size_t)");
}

Assistant:

bool
chck_pool(struct chck_pool *pool, size_t grow, size_t capacity, size_t member_size)
{
   assert(pool && member_size > 0);

   if (unlikely(!member_size))
      return false;

   *pool = (struct chck_pool){0};
   return (pool_buffer(&pool->items, grow, capacity, member_size) &&
           pool_buffer(&pool->map, grow, capacity, sizeof(bool)) &&
           pool_buffer(&pool->removed, grow, 0, sizeof(size_t)));
}